

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O3

simple_token * simple_token_new_parent(simple_token *child,unsigned_short type)

{
  size_t sVar1;
  simple_token *psVar2;
  simple_token *psVar3;
  
  if (child == (simple_token *)0x0) {
    psVar2 = (simple_token *)malloc(0x38);
    if (psVar2 == (simple_token *)0x0) {
      psVar2 = (simple_token *)0x0;
    }
    else {
      psVar2->type = type;
      psVar2->start = 0;
      psVar2->len = 0;
      psVar2->next = (simple_token *)0x0;
      psVar2->prev = (simple_token *)0x0;
      psVar2->child = (simple_token *)0x0;
      psVar2->tail = psVar2;
    }
  }
  else {
    sVar1 = child->start;
    psVar2 = (simple_token *)malloc(0x38);
    if (psVar2 != (simple_token *)0x0) {
      psVar2->type = type;
      psVar2->start = sVar1;
      psVar2->len = 0;
      psVar2->next = (simple_token *)0x0;
      psVar2->prev = (simple_token *)0x0;
      psVar2->tail = psVar2;
    }
    psVar2->child = child;
    child->prev = (simple_token *)0x0;
    if (child->next == (simple_token *)0x0) {
      psVar2->len = child->len;
    }
    else {
      do {
        psVar3 = child;
        child = psVar3->next;
      } while (psVar3->next != (simple_token *)0x0);
      psVar2->len = (psVar3->len + psVar3->start) - sVar1;
    }
  }
  return psVar2;
}

Assistant:

simple_token * simple_token_new_parent(simple_token * child, unsigned short type) {
	if (child == NULL) {
		return simple_token_new(type, 0, 0);
	}

	simple_token * t = simple_token_new(type, child->start, 0);
	t->child = child;
	child->prev = NULL;

	// Ensure that parent length correctly includes children
	if (child == NULL) {
		t->len = 0;
	} else if (child->next == NULL) {
		t->len = child->len;
	} else {
		while (child->next != NULL) {
			child = child->next;
		}

		t->len = child->start + child->len - t->start;
	}

	return t;
}